

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void highbd_transpose(uint16_t *src,ptrdiff_t pitchSrc,uint16_t *dst,ptrdiff_t pitchDst,int width,
                     int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint16_t *puVar12;
  uint16_t *puVar13;
  uint16_t *puVar14;
  undefined1 auVar15 [32];
  __m256i r [16];
  __m256i d [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined8 auStack_260 [32];
  undefined1 auStack_160 [304];
  
  if (0 < height) {
    uVar9 = 0;
    do {
      if (0 < width) {
        lVar11 = 0;
        puVar13 = dst;
        puVar14 = src;
        do {
          lVar10 = 0;
          puVar12 = puVar14;
          do {
            uVar6 = *(undefined8 *)(puVar12 + 4);
            uVar7 = *(undefined8 *)(puVar12 + 8);
            uVar8 = *(undefined8 *)(puVar12 + 0xc);
            *(undefined8 *)(local_460 + lVar10) = *(undefined8 *)puVar12;
            *(undefined8 *)(local_460 + lVar10 + 8) = uVar6;
            *(undefined8 *)(local_460 + lVar10 + 0x10) = uVar7;
            *(undefined8 *)(local_460 + lVar10 + 0x18) = uVar8;
            lVar10 = lVar10 + 0x20;
            puVar12 = puVar12 + pitchSrc;
          } while (lVar10 != 0x200);
          auVar1 = vpunpcklwd_avx2(local_460,local_440);
          auVar15 = vpunpcklwd_avx2(local_420,local_400);
          auVar2 = vpunpcklwd_avx2(local_3e0,local_3c0);
          auVar3 = vpunpcklwd_avx2(local_3a0,local_380);
          auVar4 = vpunpckldq_avx2(auVar1,auVar15);
          auVar5 = vpunpckldq_avx2(auVar2,auVar3);
          local_660 = vpunpcklqdq_avx2(auVar4,auVar5);
          local_640 = vpunpckhqdq_avx2(auVar4,auVar5);
          auVar1 = vpunpckhdq_avx2(auVar1,auVar15);
          auVar15 = vpunpckhdq_avx2(auVar2,auVar3);
          local_620 = vpunpcklqdq_avx2(auVar1,auVar15);
          local_600 = vpunpckhqdq_avx2(auVar1,auVar15);
          auVar1 = vpunpckhwd_avx2(local_460,local_440);
          auVar15 = vpunpckhwd_avx2(local_420,local_400);
          auVar2 = vpunpckhwd_avx2(local_3e0,local_3c0);
          auVar3 = vpunpckhwd_avx2(local_3a0,local_380);
          auVar4 = vpunpckldq_avx2(auVar1,auVar15);
          auVar5 = vpunpckldq_avx2(auVar2,auVar3);
          local_5e0 = vpunpcklqdq_avx2(auVar4,auVar5);
          local_5c0 = vpunpckhqdq_avx2(auVar4,auVar5);
          auVar1 = vpunpckhdq_avx2(auVar1,auVar15);
          auVar15 = vpunpckhdq_avx2(auVar2,auVar3);
          local_5a0 = vpunpcklqdq_avx2(auVar1,auVar15);
          local_580 = vpunpckhqdq_avx2(auVar1,auVar15);
          auVar1 = vpunpcklwd_avx2(local_360,local_340);
          auVar15 = vpunpcklwd_avx2(local_320,local_300);
          auVar2 = vpunpcklwd_avx2(local_2e0,local_2c0);
          auVar3 = vpunpcklwd_avx2(local_2a0,local_280);
          auVar4 = vpunpckldq_avx2(auVar1,auVar15);
          auVar5 = vpunpckldq_avx2(auVar2,auVar3);
          local_560 = vpunpcklqdq_avx2(auVar4,auVar5);
          local_540 = vpunpckhqdq_avx2(auVar4,auVar5);
          auVar1 = vpunpckhdq_avx2(auVar1,auVar15);
          auVar15 = vpunpckhdq_avx2(auVar2,auVar3);
          local_520 = vpunpcklqdq_avx2(auVar1,auVar15);
          local_500 = vpunpckhqdq_avx2(auVar1,auVar15);
          auVar1 = vpunpckhwd_avx2(local_360,local_340);
          auVar15 = vpunpckhwd_avx2(local_320,local_300);
          auVar2 = vpunpckhwd_avx2(local_2e0,local_2c0);
          auVar3 = vpunpckhwd_avx2(local_2a0,local_280);
          auVar4 = vpunpckldq_avx2(auVar1,auVar15);
          auVar5 = vpunpckldq_avx2(auVar2,auVar3);
          local_4e0 = vpunpcklqdq_avx2(auVar4,auVar5);
          local_4c0 = vpunpckhqdq_avx2(auVar4,auVar5);
          auVar1 = vpunpckhdq_avx2(auVar1,auVar15);
          auVar15 = vpunpckhdq_avx2(auVar2,auVar3);
          local_4a0 = vpunpcklqdq_avx2(auVar1,auVar15);
          local_480 = vpunpckhqdq_avx2(auVar1,auVar15);
          lVar10 = 0;
          do {
            auVar1 = vperm2f128_avx(*(undefined1 (*) [32])(local_560 + lVar10),
                                    *(undefined1 (*) [32])(local_660 + lVar10),2);
            auVar15._16_16_ = SUB3216(*(undefined1 (*) [32])(local_560 + lVar10),0x10);
            auVar15._0_16_ = *(undefined1 (*) [16])(local_660 + lVar10 + 0x10);
            *(undefined1 (*) [32])((long)auStack_260 + lVar10) = auVar1;
            *(undefined1 (*) [32])(auStack_160 + lVar10) = auVar15;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x100);
          lVar10 = 0;
          puVar12 = puVar13;
          do {
            uVar6 = *(undefined8 *)((long)auStack_260 + lVar10 + 8);
            uVar7 = *(undefined8 *)((long)auStack_260 + lVar10 + 0x10);
            uVar8 = *(undefined8 *)((long)auStack_260 + lVar10 + 0x18);
            *(undefined8 *)puVar12 = *(undefined8 *)((long)auStack_260 + lVar10);
            *(undefined8 *)(puVar12 + 4) = uVar6;
            *(undefined8 *)(puVar12 + 8) = uVar7;
            *(undefined8 *)(puVar12 + 0xc) = uVar8;
            lVar10 = lVar10 + 0x20;
            puVar12 = puVar12 + pitchDst;
          } while (lVar10 != 0x200);
          lVar11 = lVar11 + 0x10;
          puVar14 = puVar14 + pitchSrc * 0x10;
          puVar13 = puVar13 + 0x10;
        } while (lVar11 < width);
      }
      uVar9 = uVar9 + 0x10;
      src = src + 0x10;
      dst = dst + pitchDst * 0x10;
    } while (uVar9 < (uint)height);
  }
  return;
}

Assistant:

static void highbd_transpose(const uint16_t *src, ptrdiff_t pitchSrc,
                             uint16_t *dst, ptrdiff_t pitchDst, int width,
                             int height) {
  for (int j = 0; j < height; j += 16)
    for (int i = 0; i < width; i += 16)
      highbd_transpose_TX_16X16(src + i * pitchSrc + j, pitchSrc,
                                dst + j * pitchDst + i, pitchDst);
}